

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VulkanUploadHeap.cpp
# Opt level: O1

void __thiscall
Diligent::VulkanUploadHeap::ReleaseAllocatedPages(VulkanUploadHeap *this,Uint64 CmdQueueMask)

{
  pointer pUVar1;
  UploadPageInfo *Page;
  pointer Object;
  
  pUVar1 = (this->m_Pages).
           super__Vector_base<Diligent::VulkanUploadHeap::UploadPageInfo,_std::allocator<Diligent::VulkanUploadHeap::UploadPageInfo>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (Object = (this->m_Pages).
                super__Vector_base<Diligent::VulkanUploadHeap::UploadPageInfo,_std::allocator<Diligent::VulkanUploadHeap::UploadPageInfo>_>
                ._M_impl.super__Vector_impl_data._M_start; Object != pUVar1; Object = Object + 1) {
    RenderDeviceNextGenBase<Diligent::RenderDeviceBase<Diligent::EngineVkImplTraits>,Diligent::ICommandQueueVk>
    ::SafeReleaseDeviceObject<VulkanUtilities::VulkanMemoryAllocation,void>
              ((RenderDeviceNextGenBase<Diligent::RenderDeviceBase<Diligent::EngineVkImplTraits>,Diligent::ICommandQueueVk>
                *)this->m_RenderDevice,&Object->MemAllocation,CmdQueueMask);
    RenderDeviceNextGenBase<Diligent::RenderDeviceBase<Diligent::EngineVkImplTraits>,Diligent::ICommandQueueVk>
    ::
    SafeReleaseDeviceObject<VulkanUtilities::VulkanObjectWrapper<VkBuffer_T*,(VulkanUtilities::VulkanHandleTypeId)2>,void>
              ((RenderDeviceNextGenBase<Diligent::RenderDeviceBase<Diligent::EngineVkImplTraits>,Diligent::ICommandQueueVk>
                *)this->m_RenderDevice,&Object->Buffer,CmdQueueMask);
  }
  std::
  vector<Diligent::VulkanUploadHeap::UploadPageInfo,_std::allocator<Diligent::VulkanUploadHeap::UploadPageInfo>_>
  ::_M_erase_at_end(&this->m_Pages,
                    (this->m_Pages).
                    super__Vector_base<Diligent::VulkanUploadHeap::UploadPageInfo,_std::allocator<Diligent::VulkanUploadHeap::UploadPageInfo>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  this->m_CurrAllocatedSize = 0;
  (this->m_CurrPage).vkBuffer = (VkBuffer)0x0;
  (this->m_CurrPage).CurrCPUAddress = (Uint8 *)0x0;
  (this->m_CurrPage).CurrOffset = 0;
  (this->m_CurrPage).AvailableSize = 0;
  this->m_CurrFrameSize = 0;
  return;
}

Assistant:

void VulkanUploadHeap::ReleaseAllocatedPages(Uint64 CmdQueueMask)
{
    // The pages will go into the stale resources queue first, however they will move into the release
    // queue immediately when RenderDeviceVkImpl::FlushStaleResources() is called by the DeviceContextVkImpl::FinishFrame()
    for (auto& Page : m_Pages)
    {
        m_RenderDevice.SafeReleaseDeviceObject(std::move(Page.MemAllocation), CmdQueueMask);
        m_RenderDevice.SafeReleaseDeviceObject(std::move(Page.Buffer), CmdQueueMask);
    }

    m_Pages.clear();

    m_CurrPage          = CurrPageInfo{};
    m_CurrFrameSize     = 0;
    m_CurrAllocatedSize = 0;
}